

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::AddEvaluationFile
          (cmMakefile *this,string *inputFile,
          unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          *outputName,
          unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          *condition,bool inputIsContent)

{
  byte bVar1;
  PolicyStatus policyStatusCMP0070;
  cmGeneratorExpressionEvaluationFile *this_00;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  local_78;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  local_70 [3];
  string local_58;
  cmGeneratorExpressionEvaluationFile *local_38;
  byte local_29;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *puStack_28;
  bool inputIsContent_local;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *condition_local;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *outputName_local;
  string *inputFile_local;
  cmMakefile *this_local;
  
  local_29 = inputIsContent;
  puStack_28 = condition;
  condition_local = outputName;
  outputName_local =
       (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
        *)inputFile;
  inputFile_local = (string *)this;
  this_00 = (cmGeneratorExpressionEvaluationFile *)operator_new(0x50);
  std::__cxx11::string::string((string *)&local_58,(string *)outputName_local);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  unique_ptr(local_70,outputName);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  unique_ptr(&local_78,condition);
  bVar1 = local_29;
  policyStatusCMP0070 = GetPolicyStatus(this,CMP0070,false);
  cmGeneratorExpressionEvaluationFile::cmGeneratorExpressionEvaluationFile
            (this_00,&local_58,local_70,&local_78,(bool)(bVar1 & 1),policyStatusCMP0070);
  local_38 = this_00;
  std::
  vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
  ::push_back(&this->EvaluationFiles,&local_38);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr(&local_78);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr(local_70);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void cmMakefile::AddEvaluationFile(
  const std::string& inputFile,
  std::unique_ptr<cmCompiledGeneratorExpression> outputName,
  std::unique_ptr<cmCompiledGeneratorExpression> condition,
  bool inputIsContent)
{
  this->EvaluationFiles.push_back(new cmGeneratorExpressionEvaluationFile(
    inputFile, std::move(outputName), std::move(condition), inputIsContent,
    this->GetPolicyStatus(cmPolicies::CMP0070)));
}